

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hoa.cpp
# Opt level: O2

Matrix<double,__1,_3,_0,__1,_3> ear::hoa::load_points(void)

{
  double __x;
  Scalar *pSVar1;
  Index extraout_RDX;
  Index IVar2;
  Index extraout_RDX_00;
  Matrix<double,_1,3,0,_1,3> *in_RDI;
  double *pdVar3;
  size_t i;
  ulong row;
  double dVar4;
  double dVar5;
  double dVar6;
  Matrix<double,__1,_3,_0,__1,_3> MVar7;
  int local_34;
  
  local_34 = 3;
  Eigen::Matrix<double,-1,3,0,-1,3>::Matrix<unsigned_long,int>
            (in_RDI,&points_file::num_points,&local_34);
  pdVar3 = (double *)&DAT_001a6368;
  IVar2 = extraout_RDX;
  for (row = 0; row < 0x1450; row = row + 1) {
    dVar6 = pdVar3[-1];
    __x = *pdVar3;
    dVar4 = sin(__x);
    dVar5 = cos(dVar6);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)in_RDI,row,0);
    *pSVar1 = dVar4 * dVar5;
    dVar4 = sin(__x);
    dVar6 = sin(dVar6);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)in_RDI,row,1);
    *pSVar1 = dVar4 * dVar6;
    dVar6 = cos(__x);
    pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>,_1> *)in_RDI,row,2);
    *pSVar1 = dVar6;
    pdVar3 = pdVar3 + 2;
    IVar2 = extraout_RDX_00;
  }
  MVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_rows = IVar2;
  MVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage.m_data =
       (double *)in_RDI;
  return (Matrix<double,__1,_3,_0,__1,_3>)
         MVar7.super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>.m_storage;
}

Assistant:

Eigen::Matrix<double, Eigen::Dynamic, 3> ear::hoa::load_points() {
  Eigen::Matrix<double, Eigen::Dynamic, 3> points(points_file::num_points, 3);

  for (size_t i = 0; i < points_file::num_points; i++) {
    double phi = points_file::points[i][0], theta = points_file::points[i][1];
    points(i, 0) = std::sin(theta) * std::cos(phi);
    points(i, 1) = std::sin(theta) * std::sin(phi);
    points(i, 2) = std::cos(theta);
  }

  return points;
}